

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

stale_regions *
filemgr_actual_stale_regions
          (stale_regions *__return_storage_ptr__,filemgr *file,bid_t offset,size_t length)

{
  uint uVar1;
  filemgr_magic_t magic;
  long lVar2;
  ulong uVar3;
  size_t __nmemb;
  stale_data *__dest;
  size_t sVar4;
  anon_union_40_2_882dd8ce_for_stale_regions_1 *__src;
  ulong uStack_b8;
  bid_t abStack_b0 [2];
  stale_regions *local_a0;
  stale_regions *ret;
  size_t local_90;
  size_t arr_size;
  stale_data *cur_region;
  stale_data *arr;
  docblk_meta blk_meta;
  ulong uStack_60;
  bool non_consecutive;
  bid_t cur_bid;
  size_t count;
  size_t space_in_block;
  size_t cur_pos;
  size_t blocksize;
  size_t real_blocksize;
  size_t remaining;
  uint8_t *buf;
  size_t length_local;
  bid_t offset_local;
  filemgr *file_local;
  
  lVar2 = -((ulong)file->blocksize + 0xf & 0xfffffffffffffff0);
  uVar1 = file->blocksize;
  magic = file->version;
  local_a0 = __return_storage_ptr__;
  ret = __return_storage_ptr__;
  *(undefined8 *)((long)abStack_b0 + lVar2) = 0x14894e;
  blk_meta.marker = ver_non_consecutive_doc(magic);
  cur_region = (stale_data *)0x0;
  if ((bool)blk_meta.marker) {
    uVar3 = (ulong)uVar1 - 0x10;
    uStack_60 = offset / file->blocksize;
    space_in_block = offset % (ulong)file->blocksize;
    cur_bid = 0;
    real_blocksize = length;
    while (real_blocksize != 0) {
      if (cur_bid == 1) {
        __nmemb = length / uVar3 + 2;
        local_90 = __nmemb;
        *(undefined8 *)((long)abStack_b0 + lVar2) = 0x1489db;
        __dest = (stale_data *)calloc(__nmemb,0x28);
        __src = &local_a0->field_1;
        cur_region = __dest;
        *(undefined8 *)((long)abStack_b0 + lVar2) = 0x1489f8;
        memcpy(__dest,__src,0x28);
        (local_a0->field_1).regions = cur_region;
      }
      if (cur_bid == 0) {
        arr_size = (size_t)&local_a0->field_1;
      }
      else {
        arr_size = (size_t)((local_a0->field_1).regions + cur_bid);
      }
      *(ulong *)arr_size = uStack_60 * uVar1 + space_in_block;
      if (real_blocksize < uVar3 - space_in_block) {
        *(int *)(arr_size + 8) = (int)real_blocksize;
        real_blocksize = 0;
      }
      else {
        *(uint *)(arr_size + 8) = uVar1 - (int)space_in_block;
        real_blocksize = real_blocksize - (uVar3 - space_in_block);
      }
      cur_bid = cur_bid + 1;
      if (real_blocksize != 0) {
        *(undefined8 *)((long)abStack_b0 + lVar2) = 0x148ac9;
        filemgr_read(*(filemgr **)(&stack0x000000c8 + lVar2),*(bid_t *)(&stack0x000000c0 + lVar2),
                     *(void **)(&stack0x000000b8 + lVar2),
                     *(err_log_callback **)(&stack0x000000b0 + lVar2),
                     (bool)(&stack0x000000af)[lVar2]);
        arr = *(stale_data **)((long)&uStack_b8 + uVar3 + lVar2 + 0x10);
        blk_meta.next_bid = *(bid_t *)((long)abStack_b0 + uVar3 + lVar2 + 0x10);
        uStack_60 = (ulong)arr >> 0x38 | ((ulong)arr & 0xff000000000000) >> 0x28 |
                    ((ulong)arr & 0xff0000000000) >> 0x18 | ((ulong)arr & 0xff00000000) >> 8 |
                    ((ulong)arr & 0xff000000) << 8 | ((ulong)arr & 0xff0000) << 0x18 |
                    ((ulong)arr & 0xff00) << 0x28 | (long)arr << 0x38;
        space_in_block = 0;
      }
    }
    local_a0->n_regions = cur_bid;
  }
  else {
    local_a0->n_regions = 1;
    (local_a0->field_1).region.pos = offset;
    *(undefined8 *)((long)abStack_b0 + lVar2) = 0x148bc6;
    sVar4 = filemgr_actual_stale_length(file,offset,length);
    (local_a0->field_1).region.len = (uint32_t)sVar4;
  }
  return ret;
}

Assistant:

struct stale_regions filemgr_actual_stale_regions(struct filemgr *file,
                                                  bid_t offset,
                                                  size_t length)
{
    uint8_t *buf = alca(uint8_t, file->blocksize);
    size_t remaining = length;
    size_t real_blocksize = file->blocksize;
    size_t blocksize = real_blocksize;
    size_t cur_pos, space_in_block, count;
    bid_t cur_bid;
    bool non_consecutive = ver_non_consecutive_doc(file->version);
    struct docblk_meta blk_meta;
    struct stale_regions ret;
    struct stale_data *arr = NULL, *cur_region;

    if (non_consecutive) {
        blocksize -= DOCBLK_META_SIZE;

        cur_bid = offset / file->blocksize;
        // relative position in the block 'cur_bid'
        cur_pos = offset % file->blocksize;

        count = 0;
        while (remaining) {
            if (count == 1) {
                // more than one stale region .. allocate array
                size_t arr_size = (length / blocksize) + 2;
                arr = (struct stale_data *)calloc(arr_size, sizeof(struct stale_data));
                arr[0] = ret.region;
                ret.regions = arr;
            }

            if (count == 0) {
                // Since n_regions will be 1 in most cases,
                // we do not allocate heap memory when 'n_regions==1'.
                cur_region = &ret.region;
            } else {
                cur_region = &ret.regions[count];
            }
            cur_region->pos = (cur_bid * real_blocksize) + cur_pos;

            // subtract data size in the current block
            space_in_block = blocksize - cur_pos;
            if (space_in_block <= remaining) {
                // rest of the current block (including block meta)
                cur_region->len = real_blocksize - cur_pos;
                remaining -= space_in_block;
            } else {
                cur_region->len = remaining;
                remaining = 0;
            }
            count++;

            if (remaining) {
                // get next BID
                filemgr_read(file, cur_bid, (void *)buf, NULL, true);
                memcpy(&blk_meta, buf + blocksize, sizeof(blk_meta));
                cur_bid = _endian_decode(blk_meta.next_bid);
                cur_pos = 0; // beginning of the block
            }
        }
        ret.n_regions = count;

    } else {
        // doc blocks are consecutive .. always return a single region.
        ret.n_regions = 1;
        ret.region.pos = offset;
        ret.region.len = filemgr_actual_stale_length(file, offset, length);
    }

    return ret;
}